

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<char32_t>::dispose(ArrayBuilder<char32_t> *this)

{
  char32_t *firstElement;
  RemoveConst<char32_t> *pRVar1;
  char32_t *pcVar2;
  char32_t *endCopy;
  char32_t *posCopy;
  char32_t *ptrCopy;
  ArrayBuilder<char32_t> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pcVar2 = this->endPtr;
  if (firstElement != (char32_t *)0x0) {
    this->ptr = (char32_t *)0x0;
    this->pos = (RemoveConst<char32_t> *)0x0;
    this->endPtr = (char32_t *)0x0;
    ArrayDisposer::dispose<char32_t>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 2,
               (long)pcVar2 - (long)firstElement >> 2);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }